

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cabac.c
# Opt level: O0

int h264_cabac_tu(bitstream *str,h264_cabac_context *cabac,int *ctxIdx,int numidx,uint32_t cMax,
                 uint32_t *val)

{
  int iVar1;
  uint local_8c;
  int local_6c;
  uint32_t local_48;
  uint local_44;
  uint32_t tmp_1;
  int i_1;
  uint32_t tmp;
  int i;
  uint32_t *val_local;
  uint32_t cMax_local;
  int numidx_local;
  int *ctxIdx_local;
  h264_cabac_context *cabac_local;
  bitstream *str_local;
  
  _tmp = val;
  val_local._0_4_ = cMax;
  val_local._4_4_ = numidx;
  _cMax_local = ctxIdx;
  ctxIdx_local = (int *)cabac;
  cabac_local = (h264_cabac_context *)str;
  if (str->dir == VS_ENCODE) {
    if (cMax < *val) {
      fprintf(_stderr,"TU value over limit\n");
      str_local._4_4_ = 1;
    }
    else {
      for (i_1 = 0; (uint)i_1 <= *_tmp && (uint)i_1 < (uint32_t)val_local; i_1 = i_1 + 1) {
        tmp_1 = (uint32_t)((uint)i_1 < *_tmp);
        if (i_1 < val_local._4_4_) {
          local_6c = i_1;
        }
        else {
          local_6c = val_local._4_4_ + -1;
        }
        iVar1 = h264_cabac_decision((bitstream *)cabac_local,(h264_cabac_context *)ctxIdx_local,
                                    _cMax_local[local_6c],&tmp_1);
        if (iVar1 != 0) {
          return 1;
        }
      }
      str_local._4_4_ = 0;
    }
  }
  else {
    local_48 = 1;
    for (local_44 = 0; local_44 < (uint32_t)val_local; local_44 = local_44 + 1) {
      if ((int)local_44 < val_local._4_4_) {
        local_8c = local_44;
      }
      else {
        local_8c = val_local._4_4_ - 1;
      }
      iVar1 = h264_cabac_decision((bitstream *)cabac_local,(h264_cabac_context *)ctxIdx_local,
                                  _cMax_local[(int)local_8c],&local_48);
      if (iVar1 != 0) {
        return 1;
      }
      if (local_48 == 0) break;
    }
    *_tmp = local_44;
    str_local._4_4_ = 0;
  }
  return str_local._4_4_;
}

Assistant:

int h264_cabac_tu(struct bitstream *str, struct h264_cabac_context *cabac, int *ctxIdx, int numidx, uint32_t cMax, uint32_t *val) {
	if (str->dir == VS_ENCODE) {
		int i;
		if (*val > cMax) {
			fprintf(stderr, "TU value over limit\n");
			return 1;
		}
		for (i = 0; i <= *val && i < cMax; i++) {
			uint32_t tmp = i < *val;
			if (h264_cabac_decision(str, cabac, ctxIdx[i >= numidx ? numidx - 1 : i], &tmp)) return 1;
		}
		return 0;
	} else {
		int i;
		uint32_t tmp = 1;
		for (i = 0; i < cMax; i++) {
			if (h264_cabac_decision(str, cabac, ctxIdx[i >= numidx ? numidx - 1 : i], &tmp)) return 1;
			if (!tmp)
				break;
		}
		*val = i;
		return 0;		
	}
}